

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

void Abc_BufUpdateArr(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pObj_00;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  float fVar8;
  
  Abc_BufCollectTfoCone(p,pObj);
  pVVar4 = p->vTfCone;
  iVar5 = pVVar4->nSize;
  if (1 < iVar5) {
    piVar2 = pVVar4->pArray;
    iVar6 = -1;
    lVar7 = 0;
    do {
      iVar1 = piVar2[lVar7];
      piVar2[lVar7] = piVar2[iVar5 + iVar6];
      piVar2[pVVar4->nSize + iVar6] = iVar1;
      lVar7 = lVar7 + 1;
      iVar5 = pVVar4->nSize;
      iVar6 = iVar6 + -1;
    } while (lVar7 < iVar5 / 2);
  }
  if (0 < iVar5) {
    lVar7 = 0;
    do {
      iVar5 = pVVar4->pArray[lVar7];
      if (((long)iVar5 < 0) || (pVVar3 = p->pNtk->vObjs, pVVar3->nSize <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pObj_00 = (Abc_Obj_t *)pVVar3->pArray[iVar5];
      if (pObj_00 != (Abc_Obj_t *)0x0) {
        fVar8 = Abc_BufComputeArr(p,pObj_00);
        iVar5 = (int)fVar8;
        if ((int)fVar8 < p->DelayMax) {
          iVar5 = p->DelayMax;
        }
        p->DelayMax = iVar5;
        pVVar4 = p->vTfCone;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Abc_BufUpdateArr( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pNext;
    int i, Delay;
//    assert( Abc_ObjIsNode(pObj) );
    Abc_BufCollectTfoCone( p, pObj );
    Vec_IntReverseOrder( p->vTfCone );
    Abc_NtkForEachObjVec( p->vTfCone, p->pNtk, pNext, i )
    {
        Delay = Abc_BufComputeArr( p, pNext );
        p->DelayMax = Abc_MaxInt( p->DelayMax, Delay );
    }
}